

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O3

void helper_mttc0_tcbind_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  uint uVar1;
  ulong uVar2;
  TCState *pTVar3;
  uint uVar4;
  
  if ((env->CP0_VPEConf0 & 2) == 0) {
    uVar4 = 0x20001 - ((env->mvp->CP0_MVPControl & 2) == 0);
  }
  else {
    uVar2 = (long)(ulong)(byte)env->CP0_VPEControl %
            (long)*(int *)((long)env[-4].tcs[0xd].mmr + 0x2c);
    uVar4 = 0x20001 - ((env->mvp->CP0_MVPControl & 2) == 0);
    if ((uint32_t)uVar2 != env->current_tc) {
      pTVar3 = env->tcs + (uVar2 & 0xffffffff);
      goto LAB_00743365;
    }
  }
  pTVar3 = &env->active_tc;
LAB_00743365:
  uVar1 = pTVar3->CP0_TCBind;
  pTVar3->CP0_TCBind = (arg1 ^ uVar1) & uVar4 ^ uVar1;
  return;
}

Assistant:

static CPUMIPSState *mips_cpu_map_tc(CPUMIPSState *env, int *tc)
{
    CPUState *cs;
    // int vpe_idx;
    int tc_idx = *tc;

    if (!(env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP))) {
        /* Not allowed to address other CPUs.  */
        *tc = env->current_tc;
        return env;
    }

    cs = env_cpu(env);
    // vpe_idx = tc_idx / cs->nr_threads;
    *tc = tc_idx % cs->nr_threads;
    return env;

#if 0
    MIPSCPU *cpu;
    CPUState *other_cs;
    other_cs = qemu_get_cpu(vpe_idx);
    if (other_cs == NULL) {
        return env;
    }
    cpu = MIPS_CPU(other_cs);
    return &cpu->env;
#endif
}